

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ilu_ssnode_dfs.c
# Opt level: O0

int ilu_ssnode_dfs(int jcol,int kcol,int_t *asub,int_t *xa_begin,int_t *xa_end,int *marker,
                  GlobalLU_t *Glu)

{
  int_t iVar1;
  int next;
  int_t local_7c;
  int_t *piStack_78;
  int_t nzlmax;
  int_t *xlsub;
  int_t *lsub;
  int *supno;
  int *xsup;
  int local_50;
  int kmark;
  int krow;
  int nsuper;
  int_t mem_error;
  int_t nextl;
  int_t k;
  int_t i;
  int *marker_local;
  int_t *xa_end_local;
  int_t *xa_begin_local;
  int_t *asub_local;
  int local_10;
  int kcol_local;
  int jcol_local;
  
  supno = Glu->xsup;
  lsub = Glu->supno;
  xlsub = Glu->lsub;
  piStack_78 = Glu->xlsub;
  local_7c = Glu->nzlmax;
  kmark = lsub[jcol] + 1;
  lsub[jcol] = kmark;
  nsuper = piStack_78[jcol];
  nextl = jcol;
  _k = marker;
  marker_local = xa_end;
  xa_end_local = xa_begin;
  xa_begin_local = asub;
  asub_local._4_4_ = kcol;
  local_10 = jcol;
  do {
    if (asub_local._4_4_ < nextl) {
      nextl = local_10;
      if (local_10 < asub_local._4_4_) {
        while (nextl = nextl + 1, nextl <= asub_local._4_4_) {
          piStack_78[nextl] = nsuper;
        }
      }
      supno[kmark + 1] = asub_local._4_4_ + 1;
      lsub[asub_local._4_4_ + 1] = kmark;
      piStack_78[asub_local._4_4_ + 1] = nsuper;
      return 0;
    }
    for (mem_error = xa_end_local[nextl]; mem_error < marker_local[nextl]; mem_error = mem_error + 1
        ) {
      local_50 = xa_begin_local[mem_error];
      xsup._4_4_ = _k[local_50];
      if (xsup._4_4_ != asub_local._4_4_) {
        _k[local_50] = asub_local._4_4_;
        next = nsuper + 1;
        xlsub[nsuper] = local_50;
        nsuper = next;
        if (local_7c <= next) {
          iVar1 = sLUMemXpand(local_10,next,LSUB,&local_7c,Glu);
          if (iVar1 != 0) {
            return iVar1;
          }
          xlsub = Glu->lsub;
          krow = 0;
        }
      }
    }
    lsub[nextl] = kmark;
    nextl = nextl + 1;
  } while( true );
}

Assistant:

int
ilu_ssnode_dfs(
	   const int  jcol,	    /* in - start of the supernode */
	   const int  kcol,	    /* in - end of the supernode */
	   const int_t  *asub,	    /* in */
	   const int_t  *xa_begin,    /* in */
	   const int_t  *xa_end,	    /* in */
	   int	      *marker,	    /* modified */
	   GlobalLU_t *Glu	    /* modified */
	   )
{
    int_t i, k, nextl, mem_error;
    int   nsuper, krow, kmark;
    int   *xsup, *supno;
    int_t *lsub, *xlsub;
    int_t nzlmax;

    xsup    = Glu->xsup;
    supno   = Glu->supno;
    lsub    = Glu->lsub;
    xlsub   = Glu->xlsub;
    nzlmax  = Glu->nzlmax;

    nsuper = ++supno[jcol];	/* Next available supernode number */
    nextl = xlsub[jcol];

    for (i = jcol; i <= kcol; i++)
    {
	/* For each nonzero in A[*,i] */
	for (k = xa_begin[i]; k < xa_end[i]; k++)
	{
	    krow = asub[k];
	    kmark = marker[krow];
	    if ( kmark != kcol )
	    { /* First time visit krow */
		marker[krow] = kcol;
		lsub[nextl++] = krow;
		if ( nextl >= nzlmax )
		{
		    if ( (mem_error = sLUMemXpand(jcol, nextl, LSUB, &nzlmax,
			    Glu)) != 0)
			return (mem_error);
		    lsub = Glu->lsub;
		}
	    }
	}
	supno[i] = nsuper;
    }

    /* Supernode > 1 */
    if ( jcol < kcol )
	for (i = jcol+1; i <= kcol; i++) xlsub[i] = nextl;

    xsup[nsuper+1] = kcol + 1;
    supno[kcol+1]  = nsuper;
    xlsub[kcol+1]  = nextl;

    return 0;
}